

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::ShaderSubroutine::FunctionalTest18_19::iterate(FunctionalTest18_19 *this)

{
  GLuint bool_operator1_subroutine_location;
  GLuint bool_operator2_subroutine_location;
  GLuint vec4_operator1_subroutine_location;
  bool bVar1;
  NotSupportedError *this_00;
  char *description;
  uint n_subroutine_uniform_vec4_operator1;
  long lVar2;
  uint n_subroutine_uniform_vec4_operator2;
  long lVar3;
  undefined8 local_68;
  long local_60;
  long local_58;
  string local_50;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar1) {
    initTest(this);
    local_50._M_dataplus._M_p = *(pointer *)&this->m_po_subroutine_returns_false_location;
    local_68._0_4_ = this->m_po_subroutine_divide_by_two_location;
    local_68._4_4_ = this->m_po_subroutine_multiply_by_four_location;
    lVar2 = 0;
    while (lVar2 != 2) {
      bool_operator1_subroutine_location = *(GLuint *)((long)&local_50._M_dataplus._M_p + lVar2 * 4)
      ;
      lVar3 = 0;
      local_60 = lVar2;
      while (lVar3 != 2) {
        bool_operator2_subroutine_location =
             *(GLuint *)((long)&local_50._M_dataplus._M_p + lVar3 * 4);
        local_58 = lVar3;
        for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
          vec4_operator1_subroutine_location = *(GLuint *)((long)&local_68 + lVar2 * 4);
          for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
            executeTest(this,bool_operator1_subroutine_location,bool_operator2_subroutine_location,
                        vec4_operator1_subroutine_location,*(GLuint *)((long)&local_68 + lVar3 * 4))
            ;
          }
        }
        lVar3 = local_58 + 1;
      }
      lVar2 = local_60 + 1;
    }
    bVar1 = this->m_has_test_passed == false;
    if (bVar1) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar1,
               description);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"GL_ARB_shader_subroutine is not supported.",
             (allocator<char> *)&local_68);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_50);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest18_19::iterate()
{
	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Initialize all GL objects required to run the test */
	initTest();

	/* Iterate over all subroutine permutations */
	const glw::GLuint subroutine_bool_operators[] = { m_po_subroutine_returns_false_location,
													  m_po_subroutine_returns_true_location };
	const unsigned int n_subroutine_bool_operators =
		sizeof(subroutine_bool_operators) / sizeof(subroutine_bool_operators[0]);

	const glw::GLuint subroutine_vec4_operators[] = { m_po_subroutine_divide_by_two_location,
													  m_po_subroutine_multiply_by_four_location };
	const unsigned int n_subroutine_vec4_operators =
		sizeof(subroutine_vec4_operators) / sizeof(subroutine_vec4_operators[0]);

	for (unsigned int n_subroutine_uniform_bool_operator1 = 0;
		 n_subroutine_uniform_bool_operator1 < n_subroutine_bool_operators; ++n_subroutine_uniform_bool_operator1)
	{
		for (unsigned int n_subroutine_uniform_bool_operator2 = 0;
			 n_subroutine_uniform_bool_operator2 < n_subroutine_bool_operators; ++n_subroutine_uniform_bool_operator2)
		{
			for (unsigned int n_subroutine_uniform_vec4_operator1 = 0;
				 n_subroutine_uniform_vec4_operator1 < n_subroutine_vec4_operators;
				 ++n_subroutine_uniform_vec4_operator1)
			{
				for (unsigned int n_subroutine_uniform_vec4_operator2 = 0;
					 n_subroutine_uniform_vec4_operator2 < n_subroutine_vec4_operators;
					 ++n_subroutine_uniform_vec4_operator2)
				{
					executeTest(subroutine_bool_operators[n_subroutine_uniform_bool_operator1],
								subroutine_bool_operators[n_subroutine_uniform_bool_operator2],
								subroutine_vec4_operators[n_subroutine_uniform_vec4_operator1],
								subroutine_vec4_operators[n_subroutine_uniform_vec4_operator2]);
				} /* for (all subroutine vec4 operator subroutines used for processor2) */
			}	 /* for (all subroutine vec4 operator subroutines used for processor1) */
		}		  /* for (all subroutine bool operator subroutines used for operator2) */
	}			  /* for (all subroutine bool operator subroutines used for operator1) */

	/* All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}